

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  ~IfcStructuralPointAction(this);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}